

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O0

void __thiscall OPLio::OPLwriteInitState(OPLio *this,bool initopl3)

{
  uint uVar1;
  uint local_18;
  int chip;
  uint i;
  bool initopl3_local;
  OPLio *this_local;
  
  for (local_18 = 0; local_18 < this->NumChips; local_18 = local_18 + 1) {
    uVar1 = local_18 << (this->IsOPL3 & 1U);
    if (((this->IsOPL3 & 1U) != 0) && (initopl3)) {
      (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0x105,1);
      (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0x104,0);
    }
    (*this->_vptr_OPLio[4])(this,(ulong)uVar1,1,0x20);
    (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0xb,0x40);
    (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0xbd,0);
  }
  OPLshutup(this);
  return;
}

Assistant:

void OPLio::OPLwriteInitState(bool initopl3)
{
	for (uint i = 0; i < NumChips; ++i)
	{
		int chip = i << (int)IsOPL3;
		if (IsOPL3 && initopl3)
		{
			OPLwriteReg(chip, 0x105, 0x01);	// enable YMF262/OPL3 mode
			OPLwriteReg(chip, 0x104, 0x00);	// disable 4-operator mode
		}
		OPLwriteReg(chip, 0x01, 0x20);	// enable Waveform Select
		OPLwriteReg(chip, 0x0B, 0x40);	// turn off CSW mode
		OPLwriteReg(chip, 0xBD, 0x00);	// set vibrato/tremolo depth to low, set melodic mode
	}
	OPLshutup();
}